

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

int Fx_ManDivFindCubeFree(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int *piVar2;
  int Var;
  int iVar3;
  int iVar4;
  int *piVar5;
  char *__s;
  int *piVar6;
  int local_38;
  int local_34;
  
  piVar5 = vArr1->pArray;
  piVar6 = vArr2->pArray;
  piVar1 = piVar5 + vArr1->nSize;
  piVar2 = piVar6 + vArr2->nSize;
  vCubeFree->nSize = 0;
  iVar4 = 0;
  local_38 = 1;
  local_34 = 0;
LAB_00248270:
  piVar5 = piVar5 + 1;
  do {
    piVar6 = piVar6 + 1;
    while( true ) {
      if ((piVar1 <= piVar5) || (piVar2 <= piVar6)) goto LAB_002482ed;
      iVar3 = *piVar5;
      Var = *piVar6;
      if (iVar3 == Var) {
        local_34 = local_34 + 1;
        goto LAB_00248270;
      }
      if (Var <= iVar3) break;
      piVar5 = piVar5 + 1;
      iVar3 = Abc_Var2Lit(iVar3,iVar4);
      Vec_IntPush(vCubeFree,iVar3);
    }
    if (vCubeFree->nSize == 0) {
      iVar4 = 1;
      local_38 = 0;
    }
    iVar3 = Abc_Var2Lit(Var,local_38);
    Vec_IntPush(vCubeFree,iVar3);
  } while( true );
LAB_002482ed:
  for (; piVar5 < piVar1; piVar5 = piVar5 + 1) {
    iVar3 = Abc_Var2Lit(*piVar5,iVar4);
    Vec_IntPush(vCubeFree,iVar3);
  }
  for (; piVar6 < piVar2; piVar6 = piVar6 + 1) {
    iVar4 = Abc_Var2Lit(*piVar6,local_38);
    Vec_IntPush(vCubeFree,iVar4);
  }
  if (vCubeFree->nSize == 0) {
    __s = "The SOP has duplicated cubes.";
  }
  else {
    if (vCubeFree->nSize != 1) goto LAB_00248337;
    __s = "The SOP has contained cubes.";
  }
  puts(__s);
LAB_00248337:
  iVar4 = Vec_IntEntry(vCubeFree,0);
  iVar4 = Abc_LitIsCompl(iVar4);
  if (iVar4 == 0) {
    return local_34;
  }
  __assert_fail("!Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0))",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                ,0x29e,"int Fx_ManDivFindCubeFree(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int *)");
}

Assistant:

int Fx_ManDivFindCubeFree( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = vArr1->pArray + 1;  // skip variable ID
    int * pBeg2 = vArr2->pArray + 1;  // skip variable ID
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int Counter = 0, fAttr0 = 0, fAttr1 = 1;
    Vec_IntClear( vCubeFree );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++, Counter++;
        else if ( *pBeg1 < *pBeg2 )
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
        else  
        {
            if ( Vec_IntSize(vCubeFree) == 0 )
                fAttr0 = 1, fAttr1 = 0;
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
        }
    }
    while ( pBeg1 < pEnd1 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
    while ( pBeg2 < pEnd2 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
    if ( Vec_IntSize(vCubeFree) == 0 )
        printf( "The SOP has duplicated cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 1 )
        printf( "The SOP has contained cubes.\n" );
//    else if ( Vec_IntSize(vCubeFree) == 2 && Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 0))) == Abc_Lit2Var(Abc_Lit2Var(Vec_IntEntry(vCubeFree, 1))) && !*fWarning )
//        printf( "The SOP has distance-1 cubes or it is not a prime cover.  Please make sure the result verifies.\n" ), *fWarning = 1;
    assert( !Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0)) );
    return Counter;
}